

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_ParseCommandLineFlagsAndDashArgs_OneDashArg::Run(void)

{
  uint uVar1;
  int32 iVar2;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsAndDashArgs","OneDashArg");
  uVar1 = ParseTestFlag(true,3,(char **)&DAT_0015aca0);
  _GLOBAL__N_1::Test_ParseCommandLineFlagsAndDashArgs_OneDashArg::Run
            ((Test_ParseCommandLineFlagsAndDashArgs_OneDashArg *)(ulong)uVar1);
  iVar2 = ParseTestFlag(false,3,(char **)&DAT_0015aca0);
  if (iVar2 == 0) {
    FlagSaver::~FlagSaver(&local_10);
    return;
  }
  _GLOBAL__N_1::Test_ParseCommandLineFlagsAndDashArgs_OneDashArg::Run();
  FlagSaver::~FlagSaver(&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ParseCommandLineFlagsAndDashArgs, OneDashArg) {
  const char* argv[] = {
    "my_test",
    "-",
    "--test_flag=0",
    NULL,
  };

  EXPECT_EQ(0, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(0, ParseTestFlag(false, arraysize(argv) - 1, argv));
}